

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

double __thiscall
TxConfirmStats::EstimateMedianVal
          (TxConfirmStats *this,int confTarget,double sufficientTxVal,double successBreakPoint,
          uint nBlockHeight,EstimationResult *result)

{
  double dVar1;
  long lVar2;
  pointer pdVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer piVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  string_view source_file;
  bool bVar14;
  bool bVar15;
  uint uVar16;
  long lVar17;
  double *pdVar18;
  Logger *pLVar19;
  uint uVar20;
  double *pdVar21;
  uint uVar22;
  int iVar23;
  double *pdVar24;
  uint uVar25;
  double *pdVar26;
  int iVar27;
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  pointer pdVar31;
  uint uVar32;
  long in_FS_OFFSET;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  string_view str;
  string_view logging_function;
  double *in_stack_fffffffffffffe48;
  uint local_1a0;
  double local_160;
  float failed_within_target_perc;
  float passed_within_target_perc;
  double median;
  double local_148;
  double dStack_140;
  undefined1 local_138 [8];
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double adStack_f0 [2];
  int confTarget_local;
  string local_78;
  string log_msg;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar32 = this->scale;
  pdVar3 = (this->buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar5 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar20 = (int)((ulong)((long)(this->buckets->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3) >> 3) - 1;
  local_118 = -1.0;
  dStack_110 = -1.0;
  dVar10 = 0.0;
  dVar13 = 0.0;
  local_108 = 0.0;
  dStack_100 = 0.0;
  local_f8 = 0.0;
  adStack_f0[0] = 0.0;
  local_148 = -1.0;
  dStack_140 = -1.0;
  _local_138 = ZEXT816(0);
  local_128 = 0.0;
  dStack_120 = 0.0;
  uVar22 = uVar20;
  local_1a0 = uVar20;
  if ((int)uVar20 < 0) {
    pdVar31 = (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar15 = true;
    dVar40 = 0.0;
    bVar28 = 0;
    dVar34 = 0.0;
    dVar35 = 0.0;
    dVar33 = 0.0;
    dVar36 = 0.0;
    dVar1 = 0.0;
    uVar32 = uVar20;
  }
  else {
    lVar17 = (long)(int)(((confTarget + uVar32) - 1) / uVar32);
    pvVar6 = (this->confAvg).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (this->failAvg).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar31 = (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar32 = (int)((ulong)((long)(this->confAvg).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) >> 3) *
             uVar32 * -0x55555555;
    piVar8 = (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = this->decay;
    dVar40 = 0.0;
    dVar34 = 0.0;
    dVar35 = 0.0;
    dVar33 = 0.0;
    dVar36 = 0.0;
    dVar38 = 0.0;
    dVar10 = 0.0;
    dVar13 = 0.0;
    bVar15 = true;
    iVar27 = 0;
    bVar28 = 0;
    bVar14 = true;
    uVar30 = (ulong)uVar20;
    do {
      uVar29 = (uint)uVar30;
      if (bVar15) {
        bVar15 = false;
        uVar22 = uVar29;
      }
      dVar37 = dVar36 + *(double *)
                         (*(long *)&pvVar7[lVar17 + -1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         uVar30 * 8);
      uVar25 = nBlockHeight - confTarget;
      iVar23 = uVar32 - confTarget;
      if ((uint)confTarget < uVar32) {
        do {
          iVar27 = iVar27 + *(int *)(*(long *)&pvVar5[(ulong)uVar25 %
                                                      (ulong)(uint)((int)((ulong)((long)pvVar4 -
                                                                                 (long)pvVar5) >> 3)
                                                                   * -0x55555555)].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data + uVar30 * 4);
          uVar25 = uVar25 - 1;
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
      }
      dVar38 = dVar38 + pdVar31[uVar30];
      dVar11 = dVar10 + *(double *)
                         (*(long *)&pvVar6[lVar17 + -1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         uVar30 * 8);
      dVar12 = dVar13 + pdVar31[uVar30];
      iVar27 = iVar27 + piVar8[uVar30];
      dVar36 = dVar37;
      dVar10 = dVar11;
      dVar13 = dVar12;
      if (sufficientTxVal / (1.0 - dVar1) <= dVar38) {
        dVar39 = (double)iVar27;
        if (successBreakPoint <= dVar11 / (dVar12 + dVar37 + dVar39)) {
          local_128 = 0.0;
          dStack_120 = 0.0;
          _local_138 = ZEXT816(0);
          local_148 = -1.0;
          dVar10 = 0.0;
          dVar13 = 0.0;
          iVar27 = 0;
          dVar36 = 0.0;
          bVar14 = true;
          dStack_140 = -1.0;
          pdVar18 = &local_108;
          pdVar21 = &dStack_100;
          pdVar26 = &local_f8;
          pdVar24 = adStack_f0;
          bVar15 = true;
          bVar28 = 1;
          dVar33 = dVar12;
          dVar34 = dVar37;
          dVar35 = dVar39;
          dVar40 = dVar11;
          local_1a0 = uVar22;
        }
        else {
          dVar38 = 0.0;
          if (!bVar14) goto LAB_009803ac;
          uVar16 = uVar29;
          uVar25 = uVar22;
          if (uVar29 < uVar22) {
            uVar16 = uVar22;
            uVar25 = uVar29;
          }
          if (uVar25 != 0) {
            dVar38 = pdVar3[uVar25 - 1];
          }
          dStack_140 = pdVar3[uVar16];
          bVar14 = false;
          pdVar18 = (double *)local_138;
          pdVar21 = (double *)(local_138 + 8);
          pdVar26 = &local_128;
          pdVar24 = &dStack_120;
          uVar29 = uVar20;
          local_148 = dVar38;
        }
        *pdVar18 = dVar11;
        *pdVar21 = dVar12;
        *pdVar26 = dVar39;
        *pdVar24 = dVar37;
        dVar38 = 0.0;
        uVar20 = uVar29;
      }
LAB_009803ac:
      bVar9 = 0 < (long)uVar30;
      uVar30 = uVar30 - 1;
    } while (bVar9);
    dVar1 = (double)iVar27;
    dVar40 = dVar40 * 100.0;
    bVar15 = (bool)(bVar14 ^ 1U | bVar15);
    uVar32 = 0;
  }
  median = -1.0;
  uVar29 = uVar20;
  if (uVar20 < local_1a0) {
    uVar29 = local_1a0;
    local_1a0 = uVar20;
  }
  dVar38 = 0.0;
  uVar20 = local_1a0;
  do {
    dVar38 = dVar38 + pdVar31[uVar20];
    uVar20 = uVar20 + 1;
  } while (uVar20 <= uVar29);
  if ((bool)(bVar28 & dVar38 != 0.0)) {
    dVar38 = dVar38 * 0.5;
    uVar20 = local_1a0;
    do {
      dVar37 = pdVar31[uVar20];
      if (dVar38 <= dVar37) {
        median = (this->m_feerate_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar20] / dVar37;
        break;
      }
      dVar38 = dVar38 - dVar37;
      uVar20 = uVar20 + 1;
    } while (uVar20 <= uVar29);
    if (local_1a0 == 0) {
      local_118 = 0.0;
    }
    else {
      local_118 = pdVar3[local_1a0 - 1];
    }
    dStack_110 = pdVar3[uVar29];
  }
  if (!bVar15) {
    uVar20 = uVar32;
    if (uVar32 < uVar22) {
      uVar20 = uVar22;
      uVar22 = uVar32;
    }
    if (uVar22 == 0) {
      local_148 = 0.0;
    }
    else {
      local_148 = pdVar3[uVar22 - 1];
    }
    dStack_140 = pdVar3[uVar20];
    unique0x10000509 = SUB84(dVar13,0);
    local_138 = (undefined1  [8])dVar10;
    unique0x1000050d = (int)((ulong)dVar13 >> 0x20);
    local_128 = dVar1;
    dStack_120 = dVar36;
  }
  passed_within_target_perc = 0.0;
  failed_within_target_perc = 0.0;
  dVar34 = dVar33 + dVar35 + dVar34;
  if ((dVar34 != 0.0) || (NAN(dVar34))) {
    passed_within_target_perc = (float)(dVar40 / dVar34);
  }
  dVar10 = dStack_130 + local_128 + dStack_120;
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    failed_within_target_perc = (float)(((double)local_138 * 100.0) / dVar10);
  }
  confTarget_local = confTarget;
  pLVar19 = LogInstance();
  bVar15 = BCLog::Logger::WillLogCategoryLevel(pLVar19,ESTIMATEFEE,Debug);
  if (bVar15) {
    local_160 = successBreakPoint * 100.0;
    pLVar19 = LogInstance();
    bVar15 = BCLog::Logger::Enabled(pLVar19);
    if (bVar15) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::
      format<int,double,double,double,double,double,float,double,double,double,double,double,double,float,double,double,double,double>
                (&local_78,
                 (tinyformat *)
                 "FeeEst: %d > %.0f%% decay %.5f: feerate: %g from (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out) Fail: (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out)\n"
                 ,(char *)&confTarget_local,(int *)&local_160,&this->decay,&median,&local_118,
                 &dStack_110,(double *)&passed_within_target_perc,(float *)&local_108,&dStack_100,
                 &local_f8,adStack_f0,&local_148,&dStack_140,(double *)&failed_within_target_perc,
                 (float *)local_138,(double *)(local_138 + 8),&local_128,&dStack_120,
                 in_stack_fffffffffffffe48);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pLVar19 = LogInstance();
      local_78._M_dataplus._M_p = &DAT_00000058;
      local_78._M_string_length = 0xfbf8f7;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "EstimateMedianVal";
      logging_function._M_len = 0x11;
      BCLog::Logger::LogPrintStr(pLVar19,str,logging_function,source_file,0x18b,ESTIMATEFEE,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)log_msg._M_dataplus._M_p != &log_msg.field_2) {
        operator_delete(log_msg._M_dataplus._M_p,
                        CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,
                                 log_msg.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (result != (EstimationResult *)0x0) {
    (result->pass).inMempool = local_f8;
    (result->pass).leftMempool = adStack_f0[0];
    (result->pass).withinTarget = local_108;
    (result->pass).totalConfirmed = dStack_100;
    (result->pass).start = local_118;
    (result->pass).end = dStack_110;
    (result->fail).start = local_148;
    (result->fail).end = dStack_140;
    (result->fail).withinTarget = (double)local_138;
    (result->fail).totalConfirmed = dStack_130;
    (result->fail).inMempool = local_128;
    (result->fail).leftMempool = dStack_120;
    result->decay = this->decay;
    result->scale = this->scale;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return median;
}

Assistant:

double TxConfirmStats::EstimateMedianVal(int confTarget, double sufficientTxVal,
                                         double successBreakPoint, unsigned int nBlockHeight,
                                         EstimationResult *result) const
{
    // Counters for a bucket (or range of buckets)
    double nConf = 0; // Number of tx's confirmed within the confTarget
    double totalNum = 0; // Total number of tx's that were ever confirmed
    int extraNum = 0;  // Number of tx's still in mempool for confTarget or longer
    double failNum = 0; // Number of tx's that were never confirmed but removed from the mempool after confTarget
    const int periodTarget = (confTarget + scale - 1) / scale;
    const int maxbucketindex = buckets.size() - 1;

    // We'll combine buckets until we have enough samples.
    // The near and far variables will define the range we've combined
    // The best variables are the last range we saw which still had a high
    // enough confirmation rate to count as success.
    // The cur variables are the current range we're counting.
    unsigned int curNearBucket = maxbucketindex;
    unsigned int bestNearBucket = maxbucketindex;
    unsigned int curFarBucket = maxbucketindex;
    unsigned int bestFarBucket = maxbucketindex;

    // We'll always group buckets into sets that meet sufficientTxVal --
    // this ensures that we're using consistent groups between different
    // confirmation targets.
    double partialNum = 0;

    bool foundAnswer = false;
    unsigned int bins = unconfTxs.size();
    bool newBucketRange = true;
    bool passing = true;
    EstimatorBucket passBucket;
    EstimatorBucket failBucket;

    // Start counting from highest feerate transactions
    for (int bucket = maxbucketindex; bucket >= 0; --bucket) {
        if (newBucketRange) {
            curNearBucket = bucket;
            newBucketRange = false;
        }
        curFarBucket = bucket;
        nConf += confAvg[periodTarget - 1][bucket];
        partialNum += txCtAvg[bucket];
        totalNum += txCtAvg[bucket];
        failNum += failAvg[periodTarget - 1][bucket];
        for (unsigned int confct = confTarget; confct < GetMaxConfirms(); confct++)
            extraNum += unconfTxs[(nBlockHeight - confct) % bins][bucket];
        extraNum += oldUnconfTxs[bucket];
        // If we have enough transaction data points in this range of buckets,
        // we can test for success
        // (Only count the confirmed data points, so that each confirmation count
        // will be looking at the same amount of data and same bucket breaks)

        if (partialNum < sufficientTxVal / (1 - decay)) {
            // the buckets we've added in this round aren't sufficient
            // so keep adding
            continue;
        } else {
            partialNum = 0; // reset for the next range we'll add

            double curPct = nConf / (totalNum + failNum + extraNum);

            // Check to see if we are no longer getting confirmed at the success rate
            if (curPct < successBreakPoint) {
                if (passing == true) {
                    // First time we hit a failure record the failed bucket
                    unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
                    unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
                    failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
                    failBucket.end = buckets[failMaxBucket];
                    failBucket.withinTarget = nConf;
                    failBucket.totalConfirmed = totalNum;
                    failBucket.inMempool = extraNum;
                    failBucket.leftMempool = failNum;
                    passing = false;
                }
                continue;
            }
            // Otherwise update the cumulative stats, and the bucket variables
            // and reset the counters
            else {
                failBucket = EstimatorBucket(); // Reset any failed bucket, currently passing
                foundAnswer = true;
                passing = true;
                passBucket.withinTarget = nConf;
                nConf = 0;
                passBucket.totalConfirmed = totalNum;
                totalNum = 0;
                passBucket.inMempool = extraNum;
                passBucket.leftMempool = failNum;
                failNum = 0;
                extraNum = 0;
                bestNearBucket = curNearBucket;
                bestFarBucket = curFarBucket;
                newBucketRange = true;
            }
        }
    }

    double median = -1;
    double txSum = 0;

    // Calculate the "average" feerate of the best bucket range that met success conditions
    // Find the bucket with the median transaction and then report the average feerate from that bucket
    // This is a compromise between finding the median which we can't since we don't save all tx's
    // and reporting the average which is less accurate
    unsigned int minBucket = std::min(bestNearBucket, bestFarBucket);
    unsigned int maxBucket = std::max(bestNearBucket, bestFarBucket);
    for (unsigned int j = minBucket; j <= maxBucket; j++) {
        txSum += txCtAvg[j];
    }
    if (foundAnswer && txSum != 0) {
        txSum = txSum / 2;
        for (unsigned int j = minBucket; j <= maxBucket; j++) {
            if (txCtAvg[j] < txSum)
                txSum -= txCtAvg[j];
            else { // we're in the right bucket
                median = m_feerate_avg[j] / txCtAvg[j];
                break;
            }
        }

        passBucket.start = minBucket ? buckets[minBucket-1] : 0;
        passBucket.end = buckets[maxBucket];
    }

    // If we were passing until we reached last few buckets with insufficient data, then report those as failed
    if (passing && !newBucketRange) {
        unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
        unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
        failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
        failBucket.end = buckets[failMaxBucket];
        failBucket.withinTarget = nConf;
        failBucket.totalConfirmed = totalNum;
        failBucket.inMempool = extraNum;
        failBucket.leftMempool = failNum;
    }

    float passed_within_target_perc = 0.0;
    float failed_within_target_perc = 0.0;
    if ((passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool)) {
        passed_within_target_perc = 100 * passBucket.withinTarget / (passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool);
    }
    if ((failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool)) {
        failed_within_target_perc = 100 * failBucket.withinTarget / (failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool);
    }

    LogDebug(BCLog::ESTIMATEFEE, "FeeEst: %d > %.0f%% decay %.5f: feerate: %g from (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out) Fail: (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out)\n",
             confTarget, 100.0 * successBreakPoint, decay,
             median, passBucket.start, passBucket.end,
             passed_within_target_perc,
             passBucket.withinTarget, passBucket.totalConfirmed, passBucket.inMempool, passBucket.leftMempool,
             failBucket.start, failBucket.end,
             failed_within_target_perc,
             failBucket.withinTarget, failBucket.totalConfirmed, failBucket.inMempool, failBucket.leftMempool);


    if (result) {
        result->pass = passBucket;
        result->fail = failBucket;
        result->decay = decay;
        result->scale = scale;
    }
    return median;
}